

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x80e0b0;
  *(undefined8 *)&this->field_0xd0 = 0x80e128;
  *(undefined8 *)&this->field_0x88 = 0x80e0d8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x80e100;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)this = 0x80e240;
  *(undefined8 *)&this->field_0xd0 = 0x80e268;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xe8);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}